

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_tree.c
# Opt level: O2

int handle_number(void *ctx,char *string,size_t string_length)

{
  int iVar1;
  yajl_val v;
  uchar *number;
  int *piVar2;
  size_t sVar3;
  longlong lVar4;
  uint uVar5;
  double dVar6;
  char *endptr;
  
  uVar5 = 2;
  v = value_alloc(yajl_t_number);
  if (v != (yajl_val)0x0) {
    number = (uchar *)malloc(string_length + 1);
    (v->u).number.r = (char *)number;
    if (number != (uchar *)0x0) {
      memcpy(number,string,string_length);
      number[string_length] = '\0';
      (v->u).number.flags = 0;
      piVar2 = __errno_location();
      *piVar2 = 0;
      sVar3 = strlen((char *)number);
      lVar4 = yajl_parse_integer(number,(uint)sVar3);
      (v->u).number.i = lVar4;
      if (*piVar2 == 0) {
        (v->u).number.flags = 1;
        uVar5 = 3;
      }
      endptr = (char *)0x0;
      *piVar2 = 0;
      dVar6 = strtod((char *)number,&endptr);
      (v->u).number.d = dVar6;
      if ((endptr != (char *)0x0 && *piVar2 == 0) && (*endptr == '\0')) {
        (v->u).number.flags = uVar5;
      }
      iVar1 = context_add_value((context_t *)ctx,v);
      return (uint)(iVar1 == 0);
    }
    free(v);
  }
  if (*(char **)((long)ctx + 0x10) != (char *)0x0) {
    snprintf(*(char **)((long)ctx + 0x10),*(size_t *)((long)ctx + 0x18),"Out of memory");
  }
  return 0;
}

Assistant:

static int handle_number (void *ctx, const char *string, size_t string_length)
{
    yajl_val v;
    char *endptr;

    v = value_alloc(yajl_t_number);
    if (v == NULL)
        RETURN_ERROR((context_t *) ctx, STATUS_ABORT, "Out of memory");

    v->u.number.r = malloc(string_length + 1);
    if (v->u.number.r == NULL)
    {
        free(v);
        RETURN_ERROR((context_t *) ctx, STATUS_ABORT, "Out of memory");
    }
    memcpy(v->u.number.r, string, string_length);
    v->u.number.r[string_length] = 0;

    v->u.number.flags = 0;

    errno = 0;
    v->u.number.i = yajl_parse_integer((const unsigned char *) v->u.number.r,
                                       strlen(v->u.number.r));
    if (errno == 0)
        v->u.number.flags |= YAJL_NUMBER_INT_VALID;

    endptr = NULL;
    errno = 0;
    v->u.number.d = strtod(v->u.number.r, &endptr);
    if ((errno == 0) && (endptr != NULL) && (*endptr == 0))
        v->u.number.flags |= YAJL_NUMBER_DOUBLE_VALID;

    return ((context_add_value(ctx, v) == 0) ? STATUS_CONTINUE : STATUS_ABORT);
}